

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intgemm.cc
# Opt level: O2

CPUType intgemm::GetCPUID(void)

{
  uint *puVar1;
  long lVar2;
  int iVar3;
  CPUType CVar4;
  char *__s1;
  CPUType CVar5;
  
  if (GetCPUID()::kLocalCPU != '\0') {
    return GetCPUID::kLocalCPU;
  }
  iVar3 = __cxa_guard_acquire(&GetCPUID()::kLocalCPU);
  if (iVar3 == 0) {
    return GetCPUID::kLocalCPU;
  }
  puVar1 = (uint *)cpuid_basic_info(0);
  if (*puVar1 < 7) {
    if (*puVar1 != 0) goto LAB_00103407;
  }
  else {
    lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
    if ((*(uint *)(lVar2 + 0xc) >> 0xb & 1) != 0) {
      CVar4 = AVX512VNNI;
      goto LAB_00103431;
    }
    if ((*(uint *)(lVar2 + 4) >> 0x1e & 1) != 0) {
      CVar4 = AVX512BW;
      goto LAB_00103431;
    }
    if ((*(uint *)(lVar2 + 4) & 0x20) != 0) {
      CVar4 = AVX2;
      goto LAB_00103431;
    }
LAB_00103407:
    CVar4 = SSE2;
    lVar2 = cpuid_Version_info(1);
    if ((*(uint *)(lVar2 + 0xc) >> 9 & 1) != 0) {
      CVar4 = SSSE3;
      goto LAB_00103431;
    }
    if ((*(uint *)(lVar2 + 8) >> 0x1a & 1) != 0) goto LAB_00103431;
  }
  CVar4 = UNSUPPORTED;
LAB_00103431:
  CVar5 = AVX512VNNI;
  __s1 = getenv("INTGEMM_CPUID");
  if ((__s1 != (char *)0x0) && (iVar3 = strcmp(__s1,"AVX512VNNI"), iVar3 != 0)) {
    iVar3 = strcmp(__s1,"AVX512BW");
    if (iVar3 == 0) {
      CVar5 = AVX512BW;
    }
    else {
      iVar3 = strcmp(__s1,"AVX2");
      if (iVar3 == 0) {
        CVar5 = AVX2;
      }
      else {
        iVar3 = strcmp(__s1,"SSSE3");
        if (iVar3 == 0) {
          CVar5 = SSSE3;
        }
        else {
          iVar3 = strcmp(__s1,"SSE2");
          if (iVar3 == 0) {
            CVar5 = SSE2;
          }
          else {
            fprintf(_stderr,"Ignoring unrecognized INTGEMM_CPUID %s\n",__s1);
          }
        }
      }
    }
  }
  GetCPUID::kLocalCPU = CVar4;
  if (CVar5 < CVar4) {
    GetCPUID::kLocalCPU = CVar5;
  }
  __cxa_guard_release(&GetCPUID()::kLocalCPU);
  return GetCPUID::kLocalCPU;
}

Assistant:

CPUType GetCPUID() {
  static const CPUType kLocalCPU =
#ifdef INTGEMM_CPUID_ENVIRONMENT
    std::min(RealCPUID(), EnvironmentCPUID());
#else
    RealCPUID();
#endif
  return kLocalCPU;
}